

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix2d>
          (GeomPrimvar *this,matrix2d *dest,string *err)

{
  Attribute *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint32_t tyid;
  value_type *pvVar5;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar6;
  matrix2d *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<tinyusdz::value::matrix2d> pv;
  allocator local_c5;
  undefined1 local_c4 [4];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  if (dest != (matrix2d *)0x0) {
    this_00 = &this->_attr;
    bVar4 = Attribute::is_blocked(this_00);
    if (!bVar4) {
      bVar4 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar4) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)(string)0x0;
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar6 = std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at(this_01,0);
        pmVar7 = tinyusdz::value::Value::as<tinyusdz::value::matrix2d>(&pvVar6->value,false);
        if (pmVar7 != (matrix2d *)0x0) {
          dVar1 = pmVar7->m[0][0];
          dVar2 = pmVar7->m[0][1];
          dVar3 = pmVar7->m[1][1];
          dest->m[1][0] = pmVar7->m[1][0];
          dest->m[1][1] = dVar3;
          dest->m[0][0] = dVar1;
          dest->m[0][1] = dVar2;
          return (bool)(string)0x1;
        }
        return (bool)(string)0x0;
      }
      tyid = Attribute::type_id(this_00);
      bVar4 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar4) {
        if (err == (string *)0x0) {
          return (bool)(string)0x0;
        }
        std::__cxx11::string::string
                  ((string *)local_c0,"Unsupported type for GeomPrimvar. type = `{}`",
                   (allocator *)&local_70);
        Attribute::type_name_abi_cxx11_(&local_50,this_00);
        fmt::format<std::__cxx11::string>((string *)local_98,(fmt *)local_c0,&local_50,in_RCX);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)(string)0x0;
      }
      Attribute::get_value<tinyusdz::value::matrix2d>
                ((optional<tinyusdz::value::matrix2d> *)local_c0,this_00);
      local_98[0] = local_c0[0];
      if (local_c0[0] == (string)0x1) {
        local_98._24_8_ = local_c0._24_8_;
        local_98._32_8_ = local_c0._32_8_;
        local_98._8_8_ = local_c0._8_8_;
        local_98._16_8_ = local_c0._16_8_;
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::value::matrix2d>::value
                           ((optional<tinyusdz::value::matrix2d> *)local_98);
        dVar1 = pvVar5->m[0][1];
        dVar2 = pvVar5->m[1][0];
        dVar3 = pvVar5->m[1][1];
        dest->m[0][0] = pvVar5->m[0][0];
        dest->m[0][1] = dVar1;
        dest->m[1][0] = dVar2;
        dest->m[1][1] = dVar3;
        return (bool)(string)0x1;
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   &local_c5);
        local_c4 = (undefined1  [4])0x36;
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_c0,(fmt *)&local_50,(string *)local_c4,(uint *)&local_70,in_R8);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)local_c0[0];
      }
      return (bool)local_c0[0];
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}